

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::finishSection(WasmBinaryWriter *this,int32_t start)

{
  BufferWithRandomAccess *this_00;
  pointer puVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  pointer ppVar2;
  pointer ppVar3;
  IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
  IVar4;
  size_t sVar5;
  ulong uVar6;
  __node_base *p_Var7;
  __node_base *p_Var8;
  pointer ppVar9;
  __node_base *p_Var10;
  long lVar11;
  size_t *psVar12;
  U32LEB x;
  int iVar13;
  type *__range3;
  size_t i;
  IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
  IVar14;
  
  this_00 = this->o;
  i = (size_t)start;
  x.value = ((*(int *)&(this_00->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
             *(int *)&(this_00->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) - start) - 5;
  sVar5 = BufferWithRandomAccess::writeAt(this_00,i,x);
  if (sVar5 != 5) {
    if (4 < sVar5) {
      __assert_fail("sizeFieldSize < MaxLEB32Bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x9a,"void wasm::WasmBinaryWriter::finishSection(int32_t)");
    }
    if (x.value != 0) {
      puVar1 = (this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(puVar1 + sVar5 + i,puVar1 + i + 5,(long)(int)x.value);
    }
    this_01 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_01,(size_type)
                       ((this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish +
                       ((sVar5 - 5) -
                       (long)(this_01->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start)));
    if (this->sourceMap != (ostream *)0x0) {
      uVar6 = this->sourceMapLocationsSizeAtSectionStart;
      ppVar2 = (this->sourceMapLocations).
               super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->sourceMapLocations).
               super__Vector_base<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar9 = ppVar2 + uVar6;
      for (; uVar6 < (ulong)((long)ppVar3 - (long)ppVar2 >> 4); uVar6 = uVar6 + 1) {
        ppVar9->first = ppVar9->first + (sVar5 - 5);
        ppVar9 = ppVar9 + 1;
      }
    }
  }
  if (this->binaryLocationsSizeAtSectionStart !=
      (this->binaryLocations).expressions._M_h._M_element_count) {
    if (this->binaryLocationsSizeAtSectionStart != 0) {
      __assert_fail("binaryLocationsSizeAtSectionStart == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0xab,"void wasm::WasmBinaryWriter::finishSection(int32_t)");
    }
    iVar13 = start + 5;
    p_Var7 = &(this->binaryLocations).expressions._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor =
           (_Hash_node_base *)
           CONCAT44((int)((ulong)*(_Hash_node_base **)
                                  &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor >>
                         0x20) - iVar13,
                    (int)*(_Hash_node_base **)
                          &((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor - iVar13);
    }
    p_Var8 = &(this->binaryLocations).functions._M_h._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor =
           (_Hash_node_base *)
           CONCAT44((int)((ulong)*(_Hash_node_base **)
                                  &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor >>
                         0x20) - iVar13,
                    (int)*(_Hash_node_base **)
                          &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor - iVar13);
      *(int *)(p_Var8 + 3) = (int)*(size_t *)(p_Var8 + 3) - iVar13;
    }
    p_Var10 = &(this->binaryLocations).delimiters._M_h._M_before_begin;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      IVar14 = (IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
                )SmallVector<unsigned_int,_1UL>::end
                           ((SmallVector<unsigned_int,_1UL> *)(p_Var10 + 2));
      lVar11 = -4;
      for (sVar5 = 0; IVar4.index = sVar5,
          IVar4.parent = (SmallVector<unsigned_int,_1UL> *)(p_Var10 + 2), IVar14 != IVar4;
          sVar5 = sVar5 + 1) {
        psVar12 = (size_t *)((long)&(p_Var10[4]._M_nxt)->_M_nxt + lVar11);
        if (sVar5 == 0) {
          psVar12 = (size_t *)(p_Var10 + 3);
        }
        *(int *)psVar12 = (int)*psVar12 - iVar13;
        lVar11 = lVar11 + 4;
      }
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::finishSection(int32_t start) {
  // section size does not include the reserved bytes of the size field itself
  int32_t size = o.size() - start - MaxLEB32Bytes;
  auto sizeFieldSize = o.writeAt(start, U32LEB(size));
  // We can move things back if the actual LEB for the size doesn't use the
  // maximum 5 bytes. In that case we need to adjust offsets after we move
  // things backwards.
  auto adjustmentForLEBShrinking = MaxLEB32Bytes - sizeFieldSize;
  if (adjustmentForLEBShrinking) {
    // we can save some room, nice
    assert(sizeFieldSize < MaxLEB32Bytes);
    std::move(&o[start] + MaxLEB32Bytes,
              &o[start] + MaxLEB32Bytes + size,
              &o[start] + sizeFieldSize);
    o.resize(o.size() - adjustmentForLEBShrinking);
    if (sourceMap) {
      for (auto i = sourceMapLocationsSizeAtSectionStart;
           i < sourceMapLocations.size();
           ++i) {
        sourceMapLocations[i].first -= adjustmentForLEBShrinking;
      }
    }
  }

  if (binaryLocationsSizeAtSectionStart != binaryLocations.expressions.size()) {
    // We added the binary locations, adjust them: they must be relative
    // to the code section.
    assert(binaryLocationsSizeAtSectionStart == 0);
    // The section type byte is right before the LEB for the size; we want
    // offsets that are relative to the body, which is after that section type
    // byte and the the size LEB.
    auto body = start + sizeFieldSize;
    // Offsets are relative to the body of the code section: after the
    // section type byte and the size.
    // Everything was moved by the adjustment, track that. After this,
    // we are at the right absolute address.
    // We are relative to the section start.
    auto totalAdjustment = adjustmentForLEBShrinking + body;
    for (auto& [_, locations] : binaryLocations.expressions) {
      locations.start -= totalAdjustment;
      locations.end -= totalAdjustment;
    }
    for (auto& [_, locations] : binaryLocations.functions) {
      locations.start -= totalAdjustment;
      locations.declarations -= totalAdjustment;
      locations.end -= totalAdjustment;
    }
    for (auto& [_, locations] : binaryLocations.delimiters) {
      for (auto& item : locations) {
        item -= totalAdjustment;
      }
    }
  }
}